

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sx_sy_w16_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  __m256i v_val_w;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  longlong extraout_RDX;
  void *in_RSI;
  void *a;
  void *in_RDI;
  void *in_R8;
  uint in_R9D;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint8_t *src0_00;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [32];
  __m128i v;
  __m256i *in_stack_00000008;
  __m256i v_m1_b;
  __m256i v_m0_b;
  __m256i v_m0_w;
  __m256i v_rsl_w;
  __m256i v_rvsbl_w;
  __m256i v_rvsal_w;
  __m256i v_rvsl_b;
  __m256i v_rbl_b;
  __m256i v_ral_b;
  __m256i v_maxval_b;
  __m256i v_zmask_b;
  undefined8 local_440;
  undefined8 uStackY_438;
  int in_stack_fffffffffffffbd4;
  longlong in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbe0 [24];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 auVar14 [16];
  void *local_2b0;
  void *local_290;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar9 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar9 = vpinsrw_avx(auVar9,0xff,2);
  auVar9 = vpinsrw_avx(auVar9,0xff,3);
  auVar9 = vpinsrw_avx(auVar9,0xff,4);
  auVar9 = vpinsrw_avx(auVar9,0xff,5);
  auVar9 = vpinsrw_avx(auVar9,0xff,6);
  auVar1 = vpinsrw_avx(auVar9,0xff,7);
  auVar9 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar9 = vpinsrw_avx(auVar9,0xff,2);
  auVar9 = vpinsrw_avx(auVar9,0xff,3);
  auVar9 = vpinsrw_avx(auVar9,0xff,4);
  auVar9 = vpinsrw_avx(auVar9,0xff,5);
  auVar9 = vpinsrw_avx(auVar9,0xff,6);
  auVar9 = vpinsrw_avx(auVar9,0xff,7);
  uStack_70 = auVar9._0_8_;
  uStack_68 = auVar9._8_8_;
  auVar9 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar9 = vpinsrb_avx(auVar9,0x40,2);
  auVar9 = vpinsrb_avx(auVar9,0x40,3);
  auVar9 = vpinsrb_avx(auVar9,0x40,4);
  auVar9 = vpinsrb_avx(auVar9,0x40,5);
  auVar9 = vpinsrb_avx(auVar9,0x40,6);
  auVar9 = vpinsrb_avx(auVar9,0x40,7);
  auVar9 = vpinsrb_avx(auVar9,0x40,8);
  auVar9 = vpinsrb_avx(auVar9,0x40,9);
  auVar9 = vpinsrb_avx(auVar9,0x40,10);
  auVar9 = vpinsrb_avx(auVar9,0x40,0xb);
  auVar9 = vpinsrb_avx(auVar9,0x40,0xc);
  auVar9 = vpinsrb_avx(auVar9,0x40,0xd);
  auVar9 = vpinsrb_avx(auVar9,0x40,0xe);
  auVar9 = vpinsrb_avx(auVar9,0x40,0xf);
  auVar10 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar10 = vpinsrb_avx(auVar10,0x40,2);
  auVar10 = vpinsrb_avx(auVar10,0x40,3);
  auVar10 = vpinsrb_avx(auVar10,0x40,4);
  auVar10 = vpinsrb_avx(auVar10,0x40,5);
  auVar10 = vpinsrb_avx(auVar10,0x40,6);
  auVar10 = vpinsrb_avx(auVar10,0x40,7);
  auVar10 = vpinsrb_avx(auVar10,0x40,8);
  auVar10 = vpinsrb_avx(auVar10,0x40,9);
  auVar10 = vpinsrb_avx(auVar10,0x40,10);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xb);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xc);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xd);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xe);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xf);
  auVar8 = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar10;
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
  uStack_1b0 = auVar10._0_8_;
  uStack_1a8 = auVar10._8_8_;
  a = in_RSI;
  local_2b0 = in_R8;
  local_290 = in_RDI;
  auVar9 = auVar8;
  do {
    yy_loadu_256(in_stack_00000008,a);
    uVar11 = auVar10._8_8_;
    src0_00 = auVar10._0_8_;
    auVar14 = auVar9;
    yy_loadu_256((__m256i *)((long)*in_stack_00000008 + ((ulong)mask & 0xffffffff)),a);
    auVar4._16_8_ = src0_00;
    auVar4._0_16_ = auVar14;
    auVar4._24_8_ = uVar11;
    auVar3._16_8_ = auVar10._0_8_;
    auVar3._0_16_ = auVar9;
    auVar3._24_8_ = auVar10._8_8_;
    auVar13 = vpaddb_avx2(auVar4,auVar3);
    auVar6._16_8_ = uStack_70;
    auVar6._0_16_ = auVar1;
    auVar6._24_8_ = uStack_68;
    auVar2 = vpand_avx2(auVar13,auVar6);
    auVar13 = vpsrldq_avx2(auVar13,1);
    auVar5._16_8_ = uStack_70;
    auVar5._0_16_ = auVar1;
    auVar5._24_8_ = uStack_68;
    auVar13 = vpand_avx2(auVar13,auVar5);
    auVar13 = vpaddw_avx2(auVar2,auVar13);
    local_3c0 = auVar13._0_8_;
    uStack_3b8 = auVar13._8_8_;
    uStack_3b0 = auVar13._16_8_;
    uStack_3a8 = auVar13._24_8_;
    v_val_w[1] = in_stack_fffffffffffffbe0._0_8_;
    v_val_w[2] = in_stack_fffffffffffffbe0._8_8_;
    v_val_w[3] = in_stack_fffffffffffffbe0._16_8_;
    v_val_w[0] = in_stack_fffffffffffffbd8;
    yy_roundn_epu16(v_val_w,in_stack_fffffffffffffbd4);
    auVar2._8_8_ = uStack_3b8;
    auVar2._0_8_ = local_3c0;
    auVar2._16_8_ = uStack_3b0;
    auVar2._24_8_ = uStack_3a8;
    auVar13._8_8_ = uStack_3b8;
    auVar13._0_8_ = local_3c0;
    auVar13._16_8_ = uStack_3b0;
    auVar13._24_8_ = uStack_3a8;
    auVar13 = vpackuswb_avx2(auVar2,auVar13);
    auVar7._16_8_ = uStack_1b0;
    auVar7._0_16_ = auVar8;
    auVar7._24_8_ = uStack_1a8;
    auVar13 = vpsubb_avx2(auVar7,auVar13);
    in_stack_fffffffffffffbe0 = auVar13._0_24_;
    a = local_2b0;
    blend_16_u8_avx2(src0_00,auVar14._8_8_,auVar14._0_8_,auVar10._8_8_,auVar10._4_4_);
    local_440 = auVar13._0_8_;
    uStackY_438 = auVar13._8_8_;
    in_stack_fffffffffffffbd4 = auVar13._20_4_;
    in_stack_fffffffffffffbd8 = auVar13._24_8_;
    uVar11 = 0;
    uVar12 = 0;
    v[1] = extraout_RDX;
    v[0] = (longlong)a;
    xx_storeu_128(local_290,v);
    auVar10._8_8_ = uVar12;
    auVar10._0_8_ = uVar11;
    auVar9._8_8_ = uStackY_438;
    auVar9._0_8_ = local_440;
    local_290 = (void *)((long)local_290 + ((ulong)in_RSI & 0xffffffff));
    local_2b0 = (void *)((long)local_2b0 + (ulong)in_R9D);
    in_stack_00000008 = (__m256i *)((long)*in_stack_00000008 + (ulong)(uint)((int)mask << 1));
    mask_stride = mask_stride - 1;
  } while (mask_stride != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_sx_sy_w16_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h) {
  const __m256i v_zmask_b = _mm256_set1_epi16(0xFF);
  const __m256i v_maxval_b = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  do {
    const __m256i v_ral_b = yy_loadu_256(mask);
    const __m256i v_rbl_b = yy_loadu_256(mask + mask_stride);
    const __m256i v_rvsl_b = _mm256_add_epi8(v_ral_b, v_rbl_b);
    const __m256i v_rvsal_w = _mm256_and_si256(v_rvsl_b, v_zmask_b);
    const __m256i v_rvsbl_w =
        _mm256_and_si256(_mm256_srli_si256(v_rvsl_b, 1), v_zmask_b);
    const __m256i v_rsl_w = _mm256_add_epi16(v_rvsal_w, v_rvsbl_w);

    const __m256i v_m0_w = yy_roundn_epu16(v_rsl_w, 2);
    const __m256i v_m0_b = _mm256_packus_epi16(v_m0_w, v_m0_w);
    const __m256i v_m1_b = _mm256_sub_epi8(v_maxval_b, v_m0_b);

    const __m256i y_res_b = blend_16_u8_avx2(src0, src1, &v_m0_b, &v_m1_b,
                                             AOM_BLEND_A64_ROUND_BITS);

    xx_storeu_128(dst, _mm256_castsi256_si128(y_res_b));
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}